

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_loop.c
# Opt level: O2

void enc_loop_avx2_inner(uint8_t **s,uint8_t **o)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar3 = vpshufb_avx2(*(undefined1 (*) [32])*s,_DAT_0010a140);
  auVar2 = vpand_avx2(auVar3,_DAT_0010a0c0);
  auVar1 = vpmulhuw_avx2(auVar2,_DAT_0010a0e0);
  auVar2 = vpand_avx2(auVar3,_DAT_0010a100);
  auVar3 = vpsllw_avx2(auVar2,8);
  auVar2 = vpsllw_avx2(auVar2,4);
  auVar2 = vpblendw_avx2(auVar2,auVar3,0xaa);
  auVar1 = vpor_avx2(auVar2,auVar1);
  auVar2[8] = 0x33;
  auVar2._0_8_ = 0x3333333333333333;
  auVar2[9] = 0x33;
  auVar2[10] = 0x33;
  auVar2[0xb] = 0x33;
  auVar2[0xc] = 0x33;
  auVar2[0xd] = 0x33;
  auVar2[0xe] = 0x33;
  auVar2[0xf] = 0x33;
  auVar2[0x10] = 0x33;
  auVar2[0x11] = 0x33;
  auVar2[0x12] = 0x33;
  auVar2[0x13] = 0x33;
  auVar2[0x14] = 0x33;
  auVar2[0x15] = 0x33;
  auVar2[0x16] = 0x33;
  auVar2[0x17] = 0x33;
  auVar2[0x18] = 0x33;
  auVar2[0x19] = 0x33;
  auVar2[0x1a] = 0x33;
  auVar2[0x1b] = 0x33;
  auVar2[0x1c] = 0x33;
  auVar2[0x1d] = 0x33;
  auVar2[0x1e] = 0x33;
  auVar2[0x1f] = 0x33;
  auVar3 = vpsubusb_avx2(auVar1,auVar2);
  auVar4[8] = 0x19;
  auVar4._0_8_ = 0x1919191919191919;
  auVar4[9] = 0x19;
  auVar4[10] = 0x19;
  auVar4[0xb] = 0x19;
  auVar4[0xc] = 0x19;
  auVar4[0xd] = 0x19;
  auVar4[0xe] = 0x19;
  auVar4[0xf] = 0x19;
  auVar4[0x10] = 0x19;
  auVar4[0x11] = 0x19;
  auVar4[0x12] = 0x19;
  auVar4[0x13] = 0x19;
  auVar4[0x14] = 0x19;
  auVar4[0x15] = 0x19;
  auVar4[0x16] = 0x19;
  auVar4[0x17] = 0x19;
  auVar4[0x18] = 0x19;
  auVar4[0x19] = 0x19;
  auVar4[0x1a] = 0x19;
  auVar4[0x1b] = 0x19;
  auVar4[0x1c] = 0x19;
  auVar4[0x1d] = 0x19;
  auVar4[0x1e] = 0x19;
  auVar4[0x1f] = 0x19;
  auVar2 = vpcmpgtb_avx2(auVar1,auVar4);
  auVar2 = vpsubb_avx2(auVar3,auVar2);
  auVar3._16_16_ = _DAT_00109fe0;
  auVar3._0_16_ = _DAT_00109fe0;
  auVar2 = vpshufb_avx2(auVar3,auVar2);
  auVar2 = vpaddb_avx2(auVar2,auVar1);
  *(undefined1 (*) [32])*o = auVar2;
  *s = *s + 0x18;
  *o = *o + 0x20;
  return;
}

Assistant:

static inline void
enc_loop_avx2_inner (const uint8_t **s, uint8_t **o)
{
	// Load input:
	__m256i src = _mm256_loadu_si256((__m256i *) *s);

	// Reshuffle, translate, store:
	src = enc_reshuffle(src);
	src = enc_translate(src);
	_mm256_storeu_si256((__m256i *) *o, src);

	*s += 24;
	*o += 32;
}